

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

ostream * __thiscall
inja::Environment::render_to(Environment *this,ostream *os,Template *tmpl,json *data)

{
  Renderer RStack_168;
  
  Renderer::Renderer(&RStack_168,&this->render_config,&this->template_storage,
                     &this->function_storage);
  Renderer::render_to(&RStack_168,os,tmpl,data,(json *)0x0);
  Renderer::~Renderer(&RStack_168);
  return os;
}

Assistant:

std::ostream& render_to(std::ostream& os, const Template& tmpl, const json& data) {
    Renderer(render_config, template_storage, function_storage).render_to(os, tmpl, data);
    return os;
  }